

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlParserCtxtSetErrorHandler(PyObject *self,PyObject *args)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  PyObject *pPVar4;
  long lVar5;
  code *pcVar6;
  PyObject *pyobj_f;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctxt;
  
  iVar2 = _PyArg_ParseTuple_SizeT
                    (args,"OOO:xmlParserCtxtSetErrorHandler",&pyobj_ctxt,&pyobj_f,&pyobj_arg);
  if (iVar2 == 0) {
    return (PyObject *)0x0;
  }
  lVar1 = pyobj_ctxt[1].ob_refcnt;
  puVar3 = *(undefined8 **)(lVar1 + 0x1a8);
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = (undefined8 *)(*_xmlMalloc)();
    if (puVar3 == (undefined8 *)0x0) {
      iVar2 = -1;
      goto LAB_0013db73;
    }
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined8 **)(lVar1 + 0x1a8) = puVar3;
    pPVar4 = (PyObject *)0x0;
  }
  else {
    pPVar4 = (PyObject *)*puVar3;
  }
  _Py_XDECREF(pPVar4);
  if (pyobj_f != (PyObject *)0x0) {
    pyobj_f->ob_refcnt = pyobj_f->ob_refcnt + 1;
  }
  *puVar3 = pyobj_f;
  _Py_XDECREF((PyObject *)puVar3[1]);
  if (pyobj_arg != (PyObject *)0x0) {
    pyobj_arg->ob_refcnt = pyobj_arg->ob_refcnt + 1;
  }
  puVar3[1] = pyobj_arg;
  if (pyobj_f == (PyObject *)&_Py_NoneStruct) {
    pcVar6 = (code *)0x0;
    lVar5 = 0;
  }
  else {
    pcVar6 = libxml_xmlParserCtxtErrorHandler;
    lVar5 = lVar1;
  }
  xmlCtxtSetErrorHandler(lVar1,pcVar6,lVar5);
  iVar2 = 1;
LAB_0013db73:
  pPVar4 = libxml_intWrap(iVar2);
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlParserCtxtSetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) 
{
    PyObject *py_retval;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;
    PyObject *pyobj_f;
    PyObject *pyobj_arg;

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlParserCtxtSetErrorHandler",
		          &pyobj_ctxt, &pyobj_f, &pyobj_arg))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);
    if (ctxt->_private == NULL) {
	pyCtxt = xmlMalloc(sizeof(xmlParserCtxtPyCtxt));
	if (pyCtxt == NULL) {
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
	memset(pyCtxt,0,sizeof(xmlParserCtxtPyCtxt));
	ctxt->_private = pyCtxt;
    }
    else {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;
    }
    /* TODO: check f is a function ! */
    Py_XDECREF(pyCtxt->f);
    Py_XINCREF(pyobj_f);
    pyCtxt->f = pyobj_f;
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    if (pyobj_f != Py_None) {
        xmlCtxtSetErrorHandler(ctxt, libxml_xmlParserCtxtErrorHandler, ctxt);
    }
    else {
        xmlCtxtSetErrorHandler(ctxt, NULL, NULL);
    }

    py_retval = libxml_intWrap(1);
    return(py_retval);
}